

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O2

bool __thiscall
Rml::DecoratorTiledBox::Initialise(DecoratorTiledBox *this,Tile *_tiles,Texture *_textures)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  int *piVar10;
  TextureFileIndex *pTVar11;
  byte bVar12;
  Texture texture;
  
  bVar12 = 0;
  piVar10 = (int *)&this->field_0x30;
  pTVar11 = &_textures->file_index;
  for (lVar7 = 0x30; lVar7 != 0x2dc; lVar7 = lVar7 + 0x4c) {
    puVar8 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar7);
    puVar9 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar7);
    for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar11;
    texture.render_manager = ((Texture *)(pTVar11 + -2))->render_manager;
    iVar4 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar7) = iVar4;
    pTVar11 = pTVar11 + 4;
  }
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar5 == 4) break;
    iVar4 = *piVar10;
    piVar10 = piVar10 + 0x13;
    uVar3 = uVar5 + 1;
  } while (iVar4 != -1);
  if (uVar5 < 4) {
    return false;
  }
  if (*(int *)&this->field_0x290 < 0) {
    return false;
  }
  uVar1 = *(uint *)&this->field_0x160;
  uVar2 = *(uint *)&this->field_0x1ac;
  if (uVar1 == 0xffffffff) {
    if ((int)uVar2 < 0) goto LAB_0027af7f;
    puVar8 = (undefined4 *)&this->field_0x1ac;
    puVar9 = (undefined4 *)&this->field_0x160;
    for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
    }
    lVar7 = 0x194;
LAB_0027af76:
    *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar7) = 1
    ;
  }
  else {
    if (-1 < (int)uVar1 && uVar2 == 0xffffffff) {
      puVar8 = (undefined4 *)&this->field_0x160;
      puVar9 = (undefined4 *)&this->field_0x1ac;
      for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
      }
      lVar7 = 0x1e0;
      goto LAB_0027af76;
    }
LAB_0027af7f:
    if ((uVar2 & uVar1) == 0xffffffff) {
      return false;
    }
  }
  uVar1 = *(uint *)&this->field_0x1f8;
  uVar2 = *(uint *)&this->field_0x244;
  if (uVar1 == 0xffffffff) {
    if (-1 < (int)uVar2) {
      puVar8 = (undefined4 *)&this->field_0x244;
      puVar9 = (undefined4 *)&this->field_0x1f8;
      for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
      }
      lVar7 = 0x22c;
      goto LAB_0027afda;
    }
  }
  else if (-1 < (int)uVar1 && uVar2 == 0xffffffff) {
    puVar8 = (undefined4 *)&this->field_0x1f8;
    puVar9 = (undefined4 *)&this->field_0x244;
    for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar12 * -2 + 1;
    }
    lVar7 = 0x278;
LAB_0027afda:
    *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar7) = 2
    ;
    return true;
  }
  if ((uVar2 & uVar1) != 0xffffffff) {
    return true;
  }
  return false;
}

Assistant:

bool DecoratorTiledBox::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 9; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// All corners must have a valid texture.
	for (int i = TOP_LEFT_CORNER; i <= BOTTOM_RIGHT_CORNER; i++)
	{
		if (tiles[i].texture_index == -1)
			return false;
	}
	// Check that the centre tile has been specified.
	if (tiles[CENTRE].texture_index < 0)
		return false;

	// If only one side of the left / right edges have been configured, then mirror the tile for the other side.
	if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index > -1)
	{
		tiles[LEFT_EDGE] = tiles[RIGHT_EDGE];
		tiles[LEFT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT_EDGE].texture_index == -1 && tiles[LEFT_EDGE].texture_index > -1)
	{
		tiles[RIGHT_EDGE] = tiles[LEFT_EDGE];
		tiles[RIGHT_EDGE].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT_EDGE].texture_index == -1 && tiles[RIGHT_EDGE].texture_index == -1)
		return false;

	// If only one side of the top / bottom edges have been configured, then mirror the tile for the other side.
	if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index > -1)
	{
		tiles[TOP_EDGE] = tiles[BOTTOM_EDGE];
		tiles[TOP_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[BOTTOM_EDGE].texture_index == -1 && tiles[TOP_EDGE].texture_index > -1)
	{
		tiles[BOTTOM_EDGE] = tiles[TOP_EDGE];
		tiles[BOTTOM_EDGE].orientation = FLIP_VERTICAL;
	}
	else if (tiles[TOP_EDGE].texture_index == -1 && tiles[BOTTOM_EDGE].texture_index == -1)
		return false;

	return true;
}